

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

bool cmPolicies::GetPolicyID(char *id,PolicyID *pid)

{
  bool bVar1;
  PolicyID *pid_local;
  char *id_local;
  
  bVar1 = stringToId(id,pid);
  return bVar1;
}

Assistant:

bool cmPolicies::GetPolicyID(const char *id, cmPolicies::PolicyID &pid)
{
  return stringToId(id, pid);
}